

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined4 uVar42;
  undefined4 uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar55;
  undefined4 uVar56;
  byte bVar57;
  undefined4 uVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  int iVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  long lVar66;
  uint uVar67;
  ulong *puVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  GridMesh *mesh;
  ulong unaff_R13;
  size_t mask;
  long lVar74;
  ulong uVar75;
  long lVar76;
  bool bVar77;
  bool bVar78;
  float fVar79;
  float fVar85;
  float fVar86;
  vint4 ai_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar93;
  float fVar105;
  float fVar106;
  vint4 ai;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar107;
  undefined1 auVar100 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar111;
  float fVar112;
  float fVar123;
  float fVar124;
  vint4 ai_3;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  undefined1 auVar119 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 ai_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar151;
  float fVar152;
  undefined1 auVar148 [16];
  float fVar153;
  undefined1 auVar149 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  uint uVar161;
  float fVar163;
  uint uVar164;
  float fVar165;
  uint uVar166;
  undefined1 auVar162 [16];
  float fVar167;
  uint uVar168;
  float fVar169;
  uint uVar170;
  float fVar171;
  uint uVar172;
  float fVar173;
  uint uVar174;
  uint uVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [32];
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar185 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar198 [32];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined1 (*local_bb0) [16];
  ulong local_ba8;
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  ulong local_b88;
  ulong local_b80;
  ulong local_b78;
  ulong *local_b70;
  ulong *local_b68;
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  ulong local_b48;
  ulong local_b40;
  ulong local_b38;
  ulong local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  long local_b10;
  long local_b08;
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined1 local_9f0 [16];
  uint local_9e0;
  uint uStack_9dc;
  uint uStack_9d8;
  uint uStack_9d4;
  uint uStack_9d0;
  uint uStack_9cc;
  uint uStack_9c8;
  uint uStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  float local_8e0 [4];
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar56 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar148._4_4_ = uVar56;
  auVar148._0_4_ = uVar56;
  auVar148._8_4_ = uVar56;
  auVar148._12_4_ = uVar56;
  uVar56 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar157._4_4_ = uVar56;
  auVar157._0_4_ = uVar56;
  auVar157._8_4_ = uVar56;
  auVar157._12_4_ = uVar56;
  uVar56 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar162._4_4_ = uVar56;
  auVar162._0_4_ = uVar56;
  auVar162._8_4_ = uVar56;
  auVar162._12_4_ = uVar56;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar73 = uVar70 ^ 0x10;
  uVar63 = uVar71 ^ 0x10;
  uVar75 = uVar72 ^ 0x10;
  iVar62 = (tray->tnear).field_0.i[k];
  auVar193._4_4_ = iVar62;
  auVar193._0_4_ = iVar62;
  auVar193._8_4_ = iVar62;
  auVar193._12_4_ = iVar62;
  iVar62 = (tray->tfar).field_0.i[k];
  auVar195._4_4_ = iVar62;
  auVar195._0_4_ = iVar62;
  auVar195._8_4_ = iVar62;
  auVar195._12_4_ = iVar62;
  local_b38 = uVar70 >> 2;
  local_820._16_16_ = mm_lookupmask_ps._240_16_;
  local_820._0_16_ = mm_lookupmask_ps._0_16_;
  local_bb0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_b40 = uVar73 >> 2;
  local_b48 = uVar71 >> 2;
  local_b50 = uVar63 >> 2;
  local_b58 = uVar72 >> 2;
  local_b60 = uVar75 >> 2;
  auVar83._8_4_ = 0xbf800000;
  auVar83._0_8_ = 0xbf800000bf800000;
  auVar83._12_4_ = 0xbf800000;
  auVar83._16_4_ = 0xbf800000;
  auVar83._20_4_ = 0xbf800000;
  auVar83._24_4_ = 0xbf800000;
  auVar83._28_4_ = 0xbf800000;
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = &DAT_3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  _local_840 = vblendvps_avx(auVar120,auVar83,local_820);
  puVar68 = local_7f8;
  local_ba8 = uVar75;
  local_ba0 = uVar63;
  local_b98 = uVar73;
  local_b90 = uVar72;
  local_b88 = uVar71;
  local_b80 = uVar70;
  do {
    local_b70 = puVar68;
    if (puVar68 == &local_800) break;
    local_b68 = puVar68 + -1;
    uVar61 = puVar68[-1];
    local_b78 = unaff_R13;
    do {
      if ((uVar61 & 8) == 0) {
        auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar70),auVar148);
        auVar118._0_4_ = fVar1 * auVar80._0_4_;
        auVar118._4_4_ = fVar1 * auVar80._4_4_;
        auVar118._8_4_ = fVar1 * auVar80._8_4_;
        auVar118._12_4_ = fVar1 * auVar80._12_4_;
        auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar71),auVar157);
        auVar94._0_4_ = fVar2 * auVar80._0_4_;
        auVar94._4_4_ = fVar2 * auVar80._4_4_;
        auVar94._8_4_ = fVar2 * auVar80._8_4_;
        auVar94._12_4_ = fVar2 * auVar80._12_4_;
        auVar80 = vpmaxsd_avx(auVar118,auVar94);
        auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar72),auVar162);
        auVar95._0_4_ = fVar3 * auVar118._0_4_;
        auVar95._4_4_ = fVar3 * auVar118._4_4_;
        auVar95._8_4_ = fVar3 * auVar118._8_4_;
        auVar95._12_4_ = fVar3 * auVar118._12_4_;
        auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar73),auVar148);
        auVar113._0_4_ = fVar1 * auVar118._0_4_;
        auVar113._4_4_ = fVar1 * auVar118._4_4_;
        auVar113._8_4_ = fVar1 * auVar118._8_4_;
        auVar113._12_4_ = fVar1 * auVar118._12_4_;
        auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar63),auVar157);
        auVar129._0_4_ = fVar2 * auVar118._0_4_;
        auVar129._4_4_ = fVar2 * auVar118._4_4_;
        auVar129._8_4_ = fVar2 * auVar118._8_4_;
        auVar129._12_4_ = fVar2 * auVar118._12_4_;
        auVar94 = vpminsd_avx(auVar113,auVar129);
        auVar118 = vsubps_avx(*(undefined1 (*) [16])(uVar61 + 0x20 + uVar75),auVar162);
        auVar130._0_4_ = fVar3 * auVar118._0_4_;
        auVar130._4_4_ = fVar3 * auVar118._4_4_;
        auVar130._8_4_ = fVar3 * auVar118._8_4_;
        auVar130._12_4_ = fVar3 * auVar118._12_4_;
        auVar118 = vpmaxsd_avx(auVar95,auVar193);
        auVar80 = vpmaxsd_avx(auVar80,auVar118);
        auVar118 = vpminsd_avx(auVar130,auVar195);
        auVar118 = vpminsd_avx(auVar94,auVar118);
        auVar80 = vpcmpgtd_avx(auVar80,auVar118);
        uVar55 = vmovmskps_avx(auVar80);
        local_b78 = ((ulong)uVar55 ^ 0xf) & 0xff;
      }
      if ((uVar61 & 8) == 0) {
        if (local_b78 == 0) {
          uVar55 = 4;
        }
        else {
          uVar60 = uVar61 & 0xfffffffffffffff0;
          lVar59 = 0;
          if (local_b78 != 0) {
            for (; (local_b78 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          uVar55 = 0;
          uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
          uVar65 = local_b78 - 1 & local_b78;
          if (uVar65 != 0) {
            *local_b68 = uVar61;
            lVar59 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
            for (uVar65 = uVar65 - 1 & uVar65; local_b68 = local_b68 + 1, uVar65 != 0;
                uVar65 = uVar65 & uVar65 - 1) {
              *local_b68 = uVar61;
              lVar59 = 0;
              if (uVar65 != 0) {
                for (; (uVar65 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar61 = *(ulong *)(uVar60 + lVar59 * 8);
            }
          }
        }
      }
      else {
        uVar55 = 6;
      }
    } while (uVar55 == 0);
    if (uVar55 == 6) {
      local_b30 = (ulong)((uint)uVar61 & 0xf) - 8;
      bVar77 = local_b30 != 0;
      if (bVar77) {
        uVar61 = uVar61 & 0xfffffffffffffff0;
        local_b28 = 0;
        do {
          lVar59 = local_b28 * 0x58;
          local_b08 = uVar61 + lVar59;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)(uVar61 + 0x20 + lVar59);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(uVar61 + 0x24 + lVar59);
          auVar118 = vpminub_avx(auVar80,auVar96);
          auVar80 = vpcmpeqb_avx(auVar80,auVar118);
          auVar118 = vpcmpeqd_avx(auVar118,auVar118);
          auVar80 = vpmovzxbd_avx(auVar80 ^ auVar118);
          auVar80 = vpslld_avx(auVar80 ^ auVar118,0x1f);
          uVar56 = vmovmskps_avx(auVar80);
          fVar93 = *(float *)(uVar61 + 0x38 + lVar59);
          fVar86 = *(float *)(uVar61 + 0x44 + lVar59);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)(local_b38 + 0x20 + local_b08);
          auVar80 = vpmovzxbd_avx(auVar114);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar115._0_4_ = fVar93 + fVar86 * auVar80._0_4_;
          auVar115._4_4_ = fVar93 + fVar86 * auVar80._4_4_;
          auVar115._8_4_ = fVar93 + fVar86 * auVar80._8_4_;
          auVar115._12_4_ = fVar93 + fVar86 * auVar80._12_4_;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = *(ulong *)(local_b40 + 0x20 + local_b08);
          auVar80 = vpmovzxbd_avx(auVar131);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar81._0_4_ = fVar93 + fVar86 * auVar80._0_4_;
          auVar81._4_4_ = fVar93 + fVar86 * auVar80._4_4_;
          auVar81._8_4_ = fVar93 + fVar86 * auVar80._8_4_;
          auVar81._12_4_ = fVar93 + fVar86 * auVar80._12_4_;
          fVar93 = *(float *)(uVar61 + 0x3c + lVar59);
          fVar86 = *(float *)(uVar61 + 0x48 + lVar59);
          auVar136._8_8_ = 0;
          auVar136._0_8_ = *(ulong *)(local_b48 + 0x20 + local_b08);
          auVar80 = vpmovzxbd_avx(auVar136);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar137._0_4_ = fVar93 + fVar86 * auVar80._0_4_;
          auVar137._4_4_ = fVar93 + fVar86 * auVar80._4_4_;
          auVar137._8_4_ = fVar93 + fVar86 * auVar80._8_4_;
          auVar137._12_4_ = fVar93 + fVar86 * auVar80._12_4_;
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)(local_b50 + 0x20 + local_b08);
          auVar80 = vpmovzxbd_avx(auVar141);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar97._0_4_ = fVar93 + fVar86 * auVar80._0_4_;
          auVar97._4_4_ = fVar93 + fVar86 * auVar80._4_4_;
          auVar97._8_4_ = fVar93 + fVar86 * auVar80._8_4_;
          auVar97._12_4_ = fVar93 + fVar86 * auVar80._12_4_;
          fVar93 = *(float *)(uVar61 + 0x4c + lVar59);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)(local_b58 + 0x20 + local_b08);
          auVar80 = vpmovzxbd_avx(auVar142);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar145._8_8_ = 0;
          auVar145._0_8_ = *(ulong *)(local_b60 + 0x20 + local_b08);
          auVar118 = vpmovzxbd_avx(auVar145);
          auVar118 = vcvtdq2ps_avx(auVar118);
          fVar86 = *(float *)(uVar61 + 0x40 + lVar59);
          auVar143._0_4_ = fVar86 + fVar93 * auVar80._0_4_;
          auVar143._4_4_ = fVar86 + fVar93 * auVar80._4_4_;
          auVar143._8_4_ = fVar86 + fVar93 * auVar80._8_4_;
          auVar143._12_4_ = fVar86 + fVar93 * auVar80._12_4_;
          auVar132._0_4_ = fVar86 + fVar93 * auVar118._0_4_;
          auVar132._4_4_ = fVar86 + fVar93 * auVar118._4_4_;
          auVar132._8_4_ = fVar86 + fVar93 * auVar118._8_4_;
          auVar132._12_4_ = fVar86 + fVar93 * auVar118._12_4_;
          auVar80 = vsubps_avx(auVar115,auVar148);
          auVar116._0_4_ = fVar1 * auVar80._0_4_;
          auVar116._4_4_ = fVar1 * auVar80._4_4_;
          auVar116._8_4_ = fVar1 * auVar80._8_4_;
          auVar116._12_4_ = fVar1 * auVar80._12_4_;
          auVar80 = vsubps_avx(auVar137,auVar157);
          auVar138._0_4_ = fVar2 * auVar80._0_4_;
          auVar138._4_4_ = fVar2 * auVar80._4_4_;
          auVar138._8_4_ = fVar2 * auVar80._8_4_;
          auVar138._12_4_ = fVar2 * auVar80._12_4_;
          auVar80 = vpmaxsd_avx(auVar116,auVar138);
          auVar118 = vsubps_avx(auVar81,auVar148);
          auVar82._0_4_ = fVar1 * auVar118._0_4_;
          auVar82._4_4_ = fVar1 * auVar118._4_4_;
          auVar82._8_4_ = fVar1 * auVar118._8_4_;
          auVar82._12_4_ = fVar1 * auVar118._12_4_;
          auVar118 = vsubps_avx(auVar97,auVar157);
          auVar98._0_4_ = fVar2 * auVar118._0_4_;
          auVar98._4_4_ = fVar2 * auVar118._4_4_;
          auVar98._8_4_ = fVar2 * auVar118._8_4_;
          auVar98._12_4_ = fVar2 * auVar118._12_4_;
          auVar94 = vpminsd_avx(auVar82,auVar98);
          auVar118 = vsubps_avx(auVar143,auVar162);
          auVar99._0_4_ = fVar3 * auVar118._0_4_;
          auVar99._4_4_ = fVar3 * auVar118._4_4_;
          auVar99._8_4_ = fVar3 * auVar118._8_4_;
          auVar99._12_4_ = fVar3 * auVar118._12_4_;
          auVar118 = vpmaxsd_avx(auVar99,auVar193);
          auVar80 = vpmaxsd_avx(auVar80,auVar118);
          auVar118 = vsubps_avx(auVar132,auVar162);
          auVar117._0_4_ = fVar3 * auVar118._0_4_;
          auVar117._4_4_ = fVar3 * auVar118._4_4_;
          auVar117._8_4_ = fVar3 * auVar118._8_4_;
          auVar117._12_4_ = fVar3 * auVar118._12_4_;
          auVar118 = vpminsd_avx(auVar117,auVar195);
          auVar118 = vpminsd_avx(auVar94,auVar118);
          auVar80 = vpcmpgtd_avx(auVar80,auVar118);
          uVar58 = vmovmskps_avx(auVar80);
          bVar57 = ~(byte)uVar58 & (byte)uVar56;
          if (bVar57 != 0) {
            uVar63 = (ulong)bVar57;
            do {
              lVar59 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar5 = *(ushort *)(local_b08 + lVar59 * 8);
              uVar6 = *(ushort *)(local_b08 + 2 + lVar59 * 8);
              local_b18 = (ulong)*(uint *)(local_b08 + 0x50);
              uVar55 = *(uint *)(local_b08 + 4 + lVar59 * 8);
              local_b20 = (ulong)uVar55;
              pGVar7 = (context->scene->geometries).items[local_b18].ptr;
              local_b10 = *(long *)&pGVar7->field_0x58;
              lVar66 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       local_b20;
              uVar67 = uVar5 & 0x7fff;
              uVar69 = uVar6 & 0x7fff;
              uVar161 = *(uint *)(local_b10 + 4 + lVar66);
              uVar72 = (ulong)uVar161;
              uVar71 = (ulong)(uVar161 * uVar69 + *(int *)(local_b10 + lVar66) + uVar67);
              p_Var8 = pGVar7[1].intersectionFilterN;
              lVar59 = *(long *)&pGVar7[1].time_range.upper;
              auVar80 = *(undefined1 (*) [16])(lVar59 + (long)p_Var8 * uVar71);
              auVar118 = *(undefined1 (*) [16])(lVar59 + (uVar71 + 1) * (long)p_Var8);
              auVar94 = *(undefined1 (*) [16])(lVar59 + (uVar71 + uVar72) * (long)p_Var8);
              lVar76 = uVar71 + uVar72 + 1;
              auVar95 = *(undefined1 (*) [16])(lVar59 + lVar76 * (long)p_Var8);
              uVar70 = (ulong)(-1 < (short)uVar5);
              auVar113 = *(undefined1 (*) [16])(lVar59 + (uVar71 + uVar70 + 1) * (long)p_Var8);
              lVar74 = uVar70 + lVar76;
              auVar129 = *(undefined1 (*) [16])(lVar59 + lVar74 * (long)p_Var8);
              uVar70 = 0;
              if (-1 < (short)uVar6) {
                uVar70 = uVar72;
              }
              lVar64 = (uVar71 + uVar72 + uVar70) * (long)p_Var8;
              auVar130 = *(undefined1 (*) [16])(lVar59 + lVar64);
              auVar81 = *(undefined1 (*) [16])(lVar59 + (lVar76 + uVar70) * (long)p_Var8);
              auVar82 = *(undefined1 (*) [16])(lVar59 + (uVar70 + lVar74) * (long)p_Var8);
              auVar97 = vunpcklps_avx(auVar80,auVar95);
              auVar80 = vunpckhps_avx(auVar80,auVar95);
              auVar98 = vunpcklps_avx(auVar118,auVar94);
              auVar96 = vunpckhps_avx(auVar118,auVar94);
              auVar96 = vunpcklps_avx(auVar80,auVar96);
              auVar99 = vunpcklps_avx(auVar97,auVar98);
              auVar80 = vunpckhps_avx(auVar97,auVar98);
              auVar97 = vunpcklps_avx(auVar118,auVar129);
              auVar118 = vunpckhps_avx(auVar118,auVar129);
              auVar98 = vunpcklps_avx(auVar113,auVar95);
              auVar113 = vunpckhps_avx(auVar113,auVar95);
              auVar114 = vunpcklps_avx(auVar118,auVar113);
              auVar115 = vunpcklps_avx(auVar97,auVar98);
              auVar118 = vunpckhps_avx(auVar97,auVar98);
              auVar97 = vunpcklps_avx(auVar95,auVar82);
              auVar113 = vunpckhps_avx(auVar95,auVar82);
              auVar82 = vunpcklps_avx(auVar129,auVar81);
              auVar129 = vunpckhps_avx(auVar129,auVar81);
              auVar129 = vunpcklps_avx(auVar113,auVar129);
              auVar98 = vunpcklps_avx(auVar97,auVar82);
              auVar113 = vunpckhps_avx(auVar97,auVar82);
              auVar82 = vunpcklps_avx(auVar94,auVar81);
              auVar94 = vunpckhps_avx(auVar94,auVar81);
              auVar81 = vunpcklps_avx(auVar95,auVar130);
              auVar95 = vunpckhps_avx(auVar95,auVar130);
              auVar95 = vunpcklps_avx(auVar94,auVar95);
              auVar130 = vunpcklps_avx(auVar82,auVar81);
              auVar94 = vunpckhps_avx(auVar82,auVar81);
              auVar139._16_16_ = auVar98;
              auVar139._0_16_ = auVar99;
              auVar144._16_16_ = auVar113;
              auVar144._0_16_ = auVar80;
              auVar150._16_16_ = auVar129;
              auVar150._0_16_ = auVar96;
              auVar134._16_16_ = auVar115;
              auVar134._0_16_ = auVar115;
              auVar158._16_16_ = auVar118;
              auVar158._0_16_ = auVar118;
              auVar121._16_16_ = auVar114;
              auVar121._0_16_ = auVar114;
              auVar101._16_16_ = auVar130;
              auVar101._0_16_ = auVar130;
              auVar177._16_16_ = auVar94;
              auVar177._0_16_ = auVar94;
              auVar185._16_16_ = auVar95;
              auVar185._0_16_ = auVar95;
              auVar83 = vsubps_avx(auVar139,auVar134);
              auVar120 = vsubps_avx(auVar144,auVar158);
              auVar121 = vsubps_avx(auVar150,auVar121);
              auVar84 = vsubps_avx(auVar101,auVar139);
              auVar101 = vsubps_avx(auVar177,auVar144);
              auVar103 = vsubps_avx(auVar185,auVar150);
              fVar88 = auVar120._0_4_;
              fVar184 = auVar103._0_4_;
              fVar107 = auVar120._4_4_;
              fVar186 = auVar103._4_4_;
              auVar37._4_4_ = fVar186 * fVar107;
              auVar37._0_4_ = fVar184 * fVar88;
              fVar124 = auVar120._8_4_;
              fVar187 = auVar103._8_4_;
              auVar37._8_4_ = fVar187 * fVar124;
              fVar9 = auVar120._12_4_;
              fVar188 = auVar103._12_4_;
              auVar37._12_4_ = fVar188 * fVar9;
              fVar16 = auVar120._16_4_;
              fVar189 = auVar103._16_4_;
              auVar37._16_4_ = fVar189 * fVar16;
              fVar23 = auVar120._20_4_;
              fVar190 = auVar103._20_4_;
              auVar37._20_4_ = fVar190 * fVar23;
              fVar30 = auVar120._24_4_;
              fVar191 = auVar103._24_4_;
              auVar37._24_4_ = fVar191 * fVar30;
              auVar37._28_4_ = auVar130._12_4_;
              fVar90 = auVar121._0_4_;
              fVar176 = auVar101._0_4_;
              fVar108 = auVar121._4_4_;
              fVar178 = auVar101._4_4_;
              auVar38._4_4_ = fVar178 * fVar108;
              auVar38._0_4_ = fVar176 * fVar90;
              fVar125 = auVar121._8_4_;
              fVar179 = auVar101._8_4_;
              auVar38._8_4_ = fVar179 * fVar125;
              fVar10 = auVar121._12_4_;
              fVar180 = auVar101._12_4_;
              auVar38._12_4_ = fVar180 * fVar10;
              fVar17 = auVar121._16_4_;
              fVar181 = auVar101._16_4_;
              auVar38._16_4_ = fVar181 * fVar17;
              fVar24 = auVar121._20_4_;
              fVar182 = auVar101._20_4_;
              auVar38._20_4_ = fVar182 * fVar24;
              fVar31 = auVar121._24_4_;
              uVar42 = auVar114._12_4_;
              fVar183 = auVar101._24_4_;
              auVar38._24_4_ = fVar183 * fVar31;
              auVar38._28_4_ = uVar42;
              auVar121 = vsubps_avx(auVar38,auVar37);
              fVar160 = auVar84._0_4_;
              fVar163 = auVar84._4_4_;
              auVar39._4_4_ = fVar163 * fVar108;
              auVar39._0_4_ = fVar160 * fVar90;
              fVar165 = auVar84._8_4_;
              auVar39._8_4_ = fVar165 * fVar125;
              fVar167 = auVar84._12_4_;
              auVar39._12_4_ = fVar167 * fVar10;
              fVar169 = auVar84._16_4_;
              auVar39._16_4_ = fVar169 * fVar17;
              fVar171 = auVar84._20_4_;
              auVar39._20_4_ = fVar171 * fVar24;
              fVar173 = auVar84._24_4_;
              auVar39._24_4_ = fVar173 * fVar31;
              auVar39._28_4_ = uVar42;
              fVar92 = auVar83._0_4_;
              fVar109 = auVar83._4_4_;
              auVar40._4_4_ = fVar186 * fVar109;
              auVar40._0_4_ = fVar184 * fVar92;
              fVar126 = auVar83._8_4_;
              auVar40._8_4_ = fVar187 * fVar126;
              fVar11 = auVar83._12_4_;
              auVar40._12_4_ = fVar188 * fVar11;
              fVar18 = auVar83._16_4_;
              auVar40._16_4_ = fVar189 * fVar18;
              fVar25 = auVar83._20_4_;
              auVar40._20_4_ = fVar190 * fVar25;
              fVar32 = auVar83._24_4_;
              uVar43 = auVar115._12_4_;
              auVar40._24_4_ = fVar191 * fVar32;
              auVar40._28_4_ = uVar43;
              auVar37 = vsubps_avx(auVar40,auVar39);
              auVar41._4_4_ = fVar178 * fVar109;
              auVar41._0_4_ = fVar176 * fVar92;
              auVar41._8_4_ = fVar179 * fVar126;
              auVar41._12_4_ = fVar180 * fVar11;
              auVar41._16_4_ = fVar181 * fVar18;
              auVar41._20_4_ = fVar182 * fVar25;
              auVar41._24_4_ = fVar183 * fVar32;
              auVar41._28_4_ = uVar43;
              auVar192._0_4_ = fVar160 * fVar88;
              auVar192._4_4_ = fVar163 * fVar107;
              auVar192._8_4_ = fVar165 * fVar124;
              auVar192._12_4_ = fVar167 * fVar9;
              auVar192._16_4_ = fVar169 * fVar16;
              auVar192._20_4_ = fVar171 * fVar23;
              auVar192._24_4_ = fVar173 * fVar30;
              auVar192._28_4_ = 0;
              uVar56 = *(undefined4 *)(ray + k * 4);
              auVar194._4_4_ = uVar56;
              auVar194._0_4_ = uVar56;
              auVar194._8_4_ = uVar56;
              auVar194._12_4_ = uVar56;
              auVar194._16_4_ = uVar56;
              auVar194._20_4_ = uVar56;
              auVar194._24_4_ = uVar56;
              auVar194._28_4_ = uVar56;
              uVar58 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar196._4_4_ = uVar58;
              auVar196._0_4_ = uVar58;
              auVar196._8_4_ = uVar58;
              auVar196._12_4_ = uVar58;
              auVar196._16_4_ = uVar58;
              auVar196._20_4_ = uVar58;
              auVar196._24_4_ = uVar58;
              auVar196._28_4_ = uVar58;
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar198._4_4_ = uVar4;
              auVar198._0_4_ = uVar4;
              auVar198._8_4_ = uVar4;
              auVar198._12_4_ = uVar4;
              auVar198._16_4_ = uVar4;
              auVar198._20_4_ = uVar4;
              auVar198._24_4_ = uVar4;
              auVar198._28_4_ = uVar4;
              fVar93 = *(float *)(ray + k * 4 + 0x50);
              auVar38 = vsubps_avx(auVar192,auVar41);
              auVar83 = vsubps_avx(auVar139,auVar194);
              fVar86 = *(float *)(ray + k * 4 + 0x60);
              auVar120 = vsubps_avx(auVar144,auVar196);
              auVar39 = vsubps_avx(auVar150,auVar198);
              fVar147 = auVar39._0_4_;
              fVar151 = auVar39._4_4_;
              auVar44._4_4_ = fVar151 * fVar93;
              auVar44._0_4_ = fVar147 * fVar93;
              fVar152 = auVar39._8_4_;
              auVar44._8_4_ = fVar152 * fVar93;
              fVar153 = auVar39._12_4_;
              auVar44._12_4_ = fVar153 * fVar93;
              fVar154 = auVar39._16_4_;
              auVar44._16_4_ = fVar154 * fVar93;
              fVar155 = auVar39._20_4_;
              auVar44._20_4_ = fVar155 * fVar93;
              fVar156 = auVar39._24_4_;
              auVar44._24_4_ = fVar156 * fVar93;
              auVar44._28_4_ = uVar56;
              fVar89 = auVar120._0_4_;
              fVar110 = auVar120._4_4_;
              auVar45._4_4_ = fVar86 * fVar110;
              auVar45._0_4_ = fVar86 * fVar89;
              fVar127 = auVar120._8_4_;
              auVar45._8_4_ = fVar86 * fVar127;
              fVar12 = auVar120._12_4_;
              auVar45._12_4_ = fVar86 * fVar12;
              fVar19 = auVar120._16_4_;
              auVar45._16_4_ = fVar86 * fVar19;
              fVar26 = auVar120._20_4_;
              auVar45._20_4_ = fVar86 * fVar26;
              fVar33 = auVar120._24_4_;
              auVar45._24_4_ = fVar86 * fVar33;
              auVar45._28_4_ = uVar58;
              auVar120 = vsubps_avx(auVar45,auVar44);
              fVar87 = *(float *)(ray + k * 4 + 0x40);
              fVar91 = auVar83._0_4_;
              fVar111 = auVar83._4_4_;
              auVar46._4_4_ = fVar86 * fVar111;
              auVar46._0_4_ = fVar86 * fVar91;
              fVar128 = auVar83._8_4_;
              auVar46._8_4_ = fVar86 * fVar128;
              fVar13 = auVar83._12_4_;
              auVar46._12_4_ = fVar86 * fVar13;
              fVar20 = auVar83._16_4_;
              auVar46._16_4_ = fVar86 * fVar20;
              fVar27 = auVar83._20_4_;
              auVar46._20_4_ = fVar86 * fVar27;
              fVar34 = auVar83._24_4_;
              auVar46._24_4_ = fVar86 * fVar34;
              auVar46._28_4_ = uVar4;
              auVar47._4_4_ = fVar87 * fVar151;
              auVar47._0_4_ = fVar87 * fVar147;
              auVar47._8_4_ = fVar87 * fVar152;
              auVar47._12_4_ = fVar87 * fVar153;
              auVar47._16_4_ = fVar87 * fVar154;
              auVar47._20_4_ = fVar87 * fVar155;
              auVar47._24_4_ = fVar87 * fVar156;
              auVar47._28_4_ = uVar42;
              auVar40 = vsubps_avx(auVar47,auVar46);
              auVar48._4_4_ = fVar87 * fVar110;
              auVar48._0_4_ = fVar87 * fVar89;
              auVar48._8_4_ = fVar87 * fVar127;
              auVar48._12_4_ = fVar87 * fVar12;
              auVar48._16_4_ = fVar87 * fVar19;
              auVar48._20_4_ = fVar87 * fVar26;
              auVar48._24_4_ = fVar87 * fVar33;
              auVar48._28_4_ = uVar4;
              auVar49._4_4_ = fVar111 * fVar93;
              auVar49._0_4_ = fVar91 * fVar93;
              auVar49._8_4_ = fVar128 * fVar93;
              auVar49._12_4_ = fVar13 * fVar93;
              auVar49._16_4_ = fVar20 * fVar93;
              auVar49._20_4_ = fVar27 * fVar93;
              auVar49._24_4_ = fVar34 * fVar93;
              auVar49._28_4_ = uVar43;
              auVar41 = vsubps_avx(auVar49,auVar48);
              fVar105 = auVar38._0_4_;
              fVar112 = auVar38._4_4_;
              fVar79 = auVar38._8_4_;
              fVar14 = auVar38._12_4_;
              fVar21 = auVar38._16_4_;
              fVar28 = auVar38._20_4_;
              fVar35 = auVar38._24_4_;
              fVar197 = auVar37._0_4_;
              fVar199 = auVar37._4_4_;
              fVar200 = auVar37._8_4_;
              fVar201 = auVar37._12_4_;
              fVar202 = auVar37._16_4_;
              fVar203 = auVar37._20_4_;
              fVar204 = auVar37._24_4_;
              fVar106 = auVar121._0_4_;
              fVar123 = auVar121._4_4_;
              fVar85 = auVar121._8_4_;
              fVar15 = auVar121._12_4_;
              fVar22 = auVar121._16_4_;
              fVar29 = auVar121._20_4_;
              fVar36 = auVar121._24_4_;
              auVar102._0_4_ = fVar87 * fVar106 + fVar86 * fVar105 + fVar197 * fVar93;
              auVar102._4_4_ = fVar87 * fVar123 + fVar86 * fVar112 + fVar199 * fVar93;
              auVar102._8_4_ = fVar87 * fVar85 + fVar86 * fVar79 + fVar200 * fVar93;
              auVar102._12_4_ = fVar87 * fVar15 + fVar86 * fVar14 + fVar201 * fVar93;
              auVar102._16_4_ = fVar87 * fVar22 + fVar86 * fVar21 + fVar202 * fVar93;
              auVar102._20_4_ = fVar87 * fVar29 + fVar86 * fVar28 + fVar203 * fVar93;
              auVar102._24_4_ = fVar87 * fVar36 + fVar86 * fVar35 + fVar204 * fVar93;
              auVar102._28_4_ = fVar86 + fVar86 + fVar93;
              auVar135._8_4_ = 0x80000000;
              auVar135._0_8_ = 0x8000000080000000;
              auVar135._12_4_ = 0x80000000;
              auVar135._16_4_ = 0x80000000;
              auVar135._20_4_ = 0x80000000;
              auVar135._24_4_ = 0x80000000;
              auVar135._28_4_ = 0x80000000;
              auVar83 = vandps_avx(auVar102,auVar135);
              uVar161 = auVar83._0_4_;
              auVar146._0_4_ =
                   (float)(uVar161 ^
                          (uint)(fVar160 * auVar120._0_4_ +
                                fVar184 * auVar41._0_4_ + fVar176 * auVar40._0_4_));
              uVar164 = auVar83._4_4_;
              auVar146._4_4_ =
                   (float)(uVar164 ^
                          (uint)(fVar163 * auVar120._4_4_ +
                                fVar186 * auVar41._4_4_ + fVar178 * auVar40._4_4_));
              uVar166 = auVar83._8_4_;
              auVar146._8_4_ =
                   (float)(uVar166 ^
                          (uint)(fVar165 * auVar120._8_4_ +
                                fVar187 * auVar41._8_4_ + fVar179 * auVar40._8_4_));
              uVar168 = auVar83._12_4_;
              auVar146._12_4_ =
                   (float)(uVar168 ^
                          (uint)(fVar167 * auVar120._12_4_ +
                                fVar188 * auVar41._12_4_ + fVar180 * auVar40._12_4_));
              uVar170 = auVar83._16_4_;
              auVar146._16_4_ =
                   (float)(uVar170 ^
                          (uint)(fVar169 * auVar120._16_4_ +
                                fVar189 * auVar41._16_4_ + fVar181 * auVar40._16_4_));
              uVar172 = auVar83._20_4_;
              auVar146._20_4_ =
                   (float)(uVar172 ^
                          (uint)(fVar171 * auVar120._20_4_ +
                                fVar190 * auVar41._20_4_ + fVar182 * auVar40._20_4_));
              uVar174 = auVar83._24_4_;
              auVar146._24_4_ =
                   (float)(uVar174 ^
                          (uint)(fVar173 * auVar120._24_4_ +
                                fVar191 * auVar41._24_4_ + fVar183 * auVar40._24_4_));
              uVar175 = auVar83._28_4_;
              auVar146._28_4_ =
                   (float)(uVar175 ^ (uint)(auVar84._28_4_ + auVar103._28_4_ + auVar101._28_4_));
              auVar159._0_4_ =
                   (float)(uVar161 ^
                          (uint)(auVar120._0_4_ * fVar92 +
                                fVar90 * auVar41._0_4_ + fVar88 * auVar40._0_4_));
              auVar159._4_4_ =
                   (float)(uVar164 ^
                          (uint)(auVar120._4_4_ * fVar109 +
                                fVar108 * auVar41._4_4_ + fVar107 * auVar40._4_4_));
              auVar159._8_4_ =
                   (float)(uVar166 ^
                          (uint)(auVar120._8_4_ * fVar126 +
                                fVar125 * auVar41._8_4_ + fVar124 * auVar40._8_4_));
              auVar159._12_4_ =
                   (float)(uVar168 ^
                          (uint)(auVar120._12_4_ * fVar11 +
                                fVar10 * auVar41._12_4_ + fVar9 * auVar40._12_4_));
              auVar159._16_4_ =
                   (float)(uVar170 ^
                          (uint)(auVar120._16_4_ * fVar18 +
                                fVar17 * auVar41._16_4_ + fVar16 * auVar40._16_4_));
              auVar159._20_4_ =
                   (float)(uVar172 ^
                          (uint)(auVar120._20_4_ * fVar25 +
                                fVar24 * auVar41._20_4_ + fVar23 * auVar40._20_4_));
              auVar159._24_4_ =
                   (float)(uVar174 ^
                          (uint)(auVar120._24_4_ * fVar32 +
                                fVar31 * auVar41._24_4_ + fVar30 * auVar40._24_4_));
              auVar159._28_4_ =
                   (float)(uVar175 ^ (uint)(auVar121._28_4_ + auVar41._28_4_ + auVar40._28_4_));
              auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
              auVar83 = vcmpps_avx(auVar146,auVar120,5);
              auVar120 = vcmpps_avx(auVar159,auVar120,5);
              auVar83 = vandps_avx(auVar83,auVar120);
              auVar84._8_4_ = 0x7fffffff;
              auVar84._0_8_ = 0x7fffffff7fffffff;
              auVar84._12_4_ = 0x7fffffff;
              auVar84._16_4_ = 0x7fffffff;
              auVar84._20_4_ = 0x7fffffff;
              auVar84._24_4_ = 0x7fffffff;
              auVar84._28_4_ = 0x7fffffff;
              local_960 = vandps_avx(auVar102,auVar84);
              auVar120 = vcmpps_avx(auVar102,ZEXT1232(ZEXT812(0)) << 0x20,4);
              auVar83 = vandps_avx(auVar83,auVar120);
              auVar103._0_4_ = auVar159._0_4_ + auVar146._0_4_;
              auVar103._4_4_ = auVar159._4_4_ + auVar146._4_4_;
              auVar103._8_4_ = auVar159._8_4_ + auVar146._8_4_;
              auVar103._12_4_ = auVar159._12_4_ + auVar146._12_4_;
              auVar103._16_4_ = auVar159._16_4_ + auVar146._16_4_;
              auVar103._20_4_ = auVar159._20_4_ + auVar146._20_4_;
              auVar103._24_4_ = auVar159._24_4_ + auVar146._24_4_;
              auVar103._28_4_ = auVar159._28_4_ + auVar146._28_4_;
              auVar120 = vcmpps_avx(auVar103,local_960,2);
              auVar84 = auVar120 & auVar83;
              if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar84 >> 0x7f,0) != '\0') ||
                    (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar84 >> 0xbf,0) != '\0') ||
                  (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar84[0x1f] < '\0') {
                auVar83 = vandps_avx(auVar83,auVar120);
                auVar80 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
                local_980._0_4_ =
                     (float)(uVar161 ^
                            (uint)(fVar106 * fVar91 + fVar197 * fVar89 + fVar147 * fVar105));
                local_980._4_4_ =
                     (float)(uVar164 ^
                            (uint)(fVar123 * fVar111 + fVar199 * fVar110 + fVar151 * fVar112));
                local_980._8_4_ =
                     (float)(uVar166 ^
                            (uint)(fVar85 * fVar128 + fVar200 * fVar127 + fVar152 * fVar79));
                local_980._12_4_ =
                     (float)(uVar168 ^ (uint)(fVar15 * fVar13 + fVar201 * fVar12 + fVar153 * fVar14)
                            );
                local_980._16_4_ =
                     (float)(uVar170 ^ (uint)(fVar22 * fVar20 + fVar202 * fVar19 + fVar154 * fVar21)
                            );
                local_980._20_4_ =
                     (float)(uVar172 ^ (uint)(fVar29 * fVar27 + fVar203 * fVar26 + fVar155 * fVar28)
                            );
                local_980._24_4_ =
                     (float)(uVar174 ^ (uint)(fVar36 * fVar34 + fVar204 * fVar33 + fVar156 * fVar35)
                            );
                local_980._28_4_ = uVar175;
                fVar93 = *(float *)(ray + k * 4 + 0x30);
                fVar86 = local_960._0_4_;
                fVar87 = local_960._4_4_;
                auVar50._4_4_ = fVar87 * fVar93;
                auVar50._0_4_ = fVar86 * fVar93;
                fVar88 = local_960._8_4_;
                auVar50._8_4_ = fVar88 * fVar93;
                fVar90 = local_960._12_4_;
                auVar50._12_4_ = fVar90 * fVar93;
                fVar92 = local_960._16_4_;
                auVar50._16_4_ = fVar92 * fVar93;
                fVar89 = local_960._20_4_;
                auVar50._20_4_ = fVar89 * fVar93;
                fVar91 = local_960._24_4_;
                auVar50._24_4_ = fVar91 * fVar93;
                auVar50._28_4_ = fVar93;
                auVar83 = vcmpps_avx(auVar50,local_980,1);
                fVar93 = *(float *)(ray + k * 4 + 0x80);
                auVar51._4_4_ = fVar87 * fVar93;
                auVar51._0_4_ = fVar86 * fVar93;
                auVar51._8_4_ = fVar88 * fVar93;
                auVar51._12_4_ = fVar90 * fVar93;
                auVar51._16_4_ = fVar92 * fVar93;
                auVar51._20_4_ = fVar89 * fVar93;
                auVar51._24_4_ = fVar91 * fVar93;
                auVar51._28_4_ = fVar93;
                auVar120 = vcmpps_avx(local_980,auVar51,2);
                auVar83 = vandps_avx(auVar83,auVar120);
                auVar118 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
                auVar80 = vpand_avx(auVar118,auVar80);
                auVar118 = vpmovzxwd_avx(auVar80);
                auVar118 = vpslld_avx(auVar118,0x1f);
                auVar118 = vpsrad_avx(auVar118,0x1f);
                auVar80 = vpunpckhwd_avx(auVar80,auVar80);
                auVar80 = vpslld_avx(auVar80,0x1f);
                auVar80 = vpsrad_avx(auVar80,0x1f);
                local_920._16_16_ = auVar80;
                local_920._0_16_ = auVar118;
                if ((((((((local_920 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (local_920 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_920 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(local_920 >> 0x7f,0) != '\0') ||
                      (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB161(auVar80 >> 0x3f,0) != '\0') ||
                    (local_920 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar80[0xf] < '\0') {
                  auVar83 = vsubps_avx(local_960,auVar159);
                  auVar83 = vblendvps_avx(auVar146,auVar83,local_820);
                  auVar120 = vsubps_avx(local_960,auVar146);
                  auVar120 = vblendvps_avx(auVar159,auVar120,local_820);
                  local_8a0[0] = fVar106 * (float)local_840._0_4_;
                  local_8a0[1] = fVar123 * (float)local_840._4_4_;
                  local_8a0[2] = fVar85 * fStack_838;
                  local_8a0[3] = fVar15 * fStack_834;
                  fStack_890 = fVar22 * fStack_830;
                  fStack_88c = fVar29 * fStack_82c;
                  fStack_888 = fVar36 * fStack_828;
                  fStack_884 = auVar159._28_4_;
                  local_880[0] = fVar197 * (float)local_840._0_4_;
                  local_880[1] = fVar199 * (float)local_840._4_4_;
                  local_880[2] = fVar200 * fStack_838;
                  local_880[3] = fVar201 * fStack_834;
                  fStack_870 = fVar202 * fStack_830;
                  fStack_86c = fVar203 * fStack_82c;
                  fStack_868 = fVar204 * fStack_828;
                  fStack_864 = auVar159._28_4_;
                  local_860[0] = (float)local_840._0_4_ * fVar105;
                  local_860[1] = (float)local_840._4_4_ * fVar112;
                  local_860[2] = fStack_838 * fVar79;
                  local_860[3] = fStack_834 * fVar14;
                  fStack_850 = fStack_830 * fVar21;
                  fStack_84c = fStack_82c * fVar28;
                  fStack_848 = fStack_828 * fVar35;
                  fStack_844 = auVar159._28_4_;
                  auVar80 = vpshufd_avx(ZEXT416(uVar67),0);
                  auVar80 = vpaddd_avx(auVar80,_DAT_0201c990);
                  auVar118 = vpshufd_avx(ZEXT416(uVar69),0);
                  auVar118 = vpaddd_avx(auVar118,_DAT_0201c9a0);
                  auVar133._0_4_ = (float)(int)(*(ushort *)(local_b10 + 8 + lVar66) - 1);
                  auVar149._4_12_ = auVar39._4_12_;
                  auVar133._4_12_ = auVar149._4_12_;
                  auVar94 = vrcpss_avx(auVar133,auVar133);
                  auVar149._0_4_ = (float)(int)(*(ushort *)(local_b10 + 10 + lVar66) - 1);
                  auVar95 = vrcpss_avx(auVar149,auVar149);
                  auVar104._16_16_ = auVar80;
                  auVar104._0_16_ = auVar80;
                  auVar84 = vcvtdq2ps_avx(auVar104);
                  fVar111 = auVar84._28_4_ + auVar83._28_4_;
                  auVar80 = ZEXT416((uint)(auVar94._0_4_ * (2.0 - auVar94._0_4_ * auVar133._0_4_)));
                  auVar80 = vshufps_avx(auVar80,auVar80,0);
                  fVar93 = (fVar86 * auVar84._0_4_ + auVar83._0_4_) * auVar80._0_4_;
                  fVar105 = (fVar87 * auVar84._4_4_ + auVar83._4_4_) * auVar80._4_4_;
                  local_9c0._4_4_ = fVar105;
                  local_9c0._0_4_ = fVar93;
                  fVar106 = (fVar88 * auVar84._8_4_ + auVar83._8_4_) * auVar80._8_4_;
                  local_9c0._8_4_ = fVar106;
                  fVar107 = (fVar90 * auVar84._12_4_ + auVar83._12_4_) * auVar80._12_4_;
                  local_9c0._12_4_ = fVar107;
                  fVar108 = (fVar92 * auVar84._16_4_ + auVar83._16_4_) * auVar80._0_4_;
                  local_9c0._16_4_ = fVar108;
                  fVar109 = (fVar89 * auVar84._20_4_ + auVar83._20_4_) * auVar80._4_4_;
                  local_9c0._20_4_ = fVar109;
                  fVar110 = (fVar91 * auVar84._24_4_ + auVar83._24_4_) * auVar80._8_4_;
                  local_9c0._24_4_ = fVar110;
                  local_9c0._28_4_ = fVar111;
                  auVar122._16_16_ = auVar118;
                  auVar122._0_16_ = auVar118;
                  auVar83 = vcvtdq2ps_avx(auVar122);
                  auVar80 = ZEXT416((uint)(auVar95._0_4_ * (2.0 - auVar95._0_4_ * auVar149._0_4_)));
                  auVar80 = vshufps_avx(auVar80,auVar80,0);
                  fVar112 = (fVar86 * auVar83._0_4_ + auVar120._0_4_) * auVar80._0_4_;
                  fVar123 = (fVar87 * auVar83._4_4_ + auVar120._4_4_) * auVar80._4_4_;
                  local_9a0._4_4_ = fVar123;
                  local_9a0._0_4_ = fVar112;
                  fVar124 = (fVar88 * auVar83._8_4_ + auVar120._8_4_) * auVar80._8_4_;
                  local_9a0._8_4_ = fVar124;
                  fVar125 = (fVar90 * auVar83._12_4_ + auVar120._12_4_) * auVar80._12_4_;
                  local_9a0._12_4_ = fVar125;
                  fVar126 = (fVar92 * auVar83._16_4_ + auVar120._16_4_) * auVar80._0_4_;
                  local_9a0._16_4_ = fVar126;
                  fVar127 = (fVar89 * auVar83._20_4_ + auVar120._20_4_) * auVar80._4_4_;
                  local_9a0._20_4_ = fVar127;
                  fVar128 = (fVar91 * auVar83._24_4_ + auVar120._24_4_) * auVar80._8_4_;
                  local_9a0._24_4_ = fVar128;
                  local_9a0._28_4_ = auVar83._28_4_ + auVar120._28_4_;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00384aca;
                    auVar83 = vrcpps_avx(local_960);
                    fVar79 = auVar83._0_4_;
                    fVar85 = auVar83._4_4_;
                    auVar52._4_4_ = fVar87 * fVar85;
                    auVar52._0_4_ = fVar86 * fVar79;
                    fVar86 = auVar83._8_4_;
                    auVar52._8_4_ = fVar88 * fVar86;
                    fVar87 = auVar83._12_4_;
                    auVar52._12_4_ = fVar90 * fVar87;
                    fVar88 = auVar83._16_4_;
                    auVar52._16_4_ = fVar92 * fVar88;
                    fVar90 = auVar83._20_4_;
                    auVar52._20_4_ = fVar89 * fVar90;
                    fVar92 = auVar83._24_4_;
                    auVar52._24_4_ = fVar91 * fVar92;
                    auVar52._28_4_ = local_960._28_4_;
                    auVar140._8_4_ = 0x3f800000;
                    auVar140._0_8_ = &DAT_3f8000003f800000;
                    auVar140._12_4_ = 0x3f800000;
                    auVar140._16_4_ = 0x3f800000;
                    auVar140._20_4_ = 0x3f800000;
                    auVar140._24_4_ = 0x3f800000;
                    auVar140._28_4_ = 0x3f800000;
                    auVar120 = vsubps_avx(auVar140,auVar52);
                    fVar79 = fVar79 + fVar79 * auVar120._0_4_;
                    fVar85 = fVar85 + fVar85 * auVar120._4_4_;
                    fVar86 = fVar86 + fVar86 * auVar120._8_4_;
                    fVar87 = fVar87 + fVar87 * auVar120._12_4_;
                    fVar88 = fVar88 + fVar88 * auVar120._16_4_;
                    fVar90 = fVar90 + fVar90 * auVar120._20_4_;
                    fVar92 = fVar92 + fVar92 * auVar120._24_4_;
                    local_8c0._4_4_ = fVar85 * local_980._4_4_;
                    local_8c0._0_4_ = fVar79 * local_980._0_4_;
                    local_8c0._8_4_ = fVar86 * local_980._8_4_;
                    local_8c0._12_4_ = fVar87 * local_980._12_4_;
                    local_8c0._16_4_ = fVar88 * local_980._16_4_;
                    local_8c0._20_4_ = fVar90 * local_980._20_4_;
                    local_8c0._24_4_ = fVar92 * local_980._24_4_;
                    local_8c0._28_4_ = auVar83._28_4_;
                    local_900._4_4_ = fVar105 * fVar85;
                    local_900._0_4_ = fVar93 * fVar79;
                    local_900._8_4_ = fVar106 * fVar86;
                    local_900._12_4_ = fVar107 * fVar87;
                    local_900._16_4_ = fVar108 * fVar88;
                    local_900._20_4_ = fVar109 * fVar90;
                    local_900._24_4_ = fVar110 * fVar92;
                    local_900._28_4_ = fVar111;
                    local_8e0[0] = fVar112 * fVar79;
                    local_8e0[1] = fVar123 * fVar85;
                    local_8e0[2] = fVar124 * fVar86;
                    local_8e0[3] = fVar125 * fVar87;
                    fStack_8d0 = fVar126 * fVar88;
                    fStack_8cc = fVar127 * fVar90;
                    fStack_8c8 = fVar128 * fVar92;
                    fStack_8c4 = auVar83._28_4_ + auVar120._28_4_;
                    iVar62 = vmovmskps_avx(local_920);
                    uVar71 = CONCAT44((int)((ulong)lVar64 >> 0x20),iVar62);
                    uVar70 = 0;
                    if (uVar71 != 0) {
                      for (; (uVar71 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                      }
                    }
                    bVar78 = iVar62 != 0;
                    if (bVar78) {
                      local_b00 = vpshufd_avx(ZEXT416(*(uint *)(local_b08 + 0x50)),0);
                      auStack_af0 = auVar121._16_16_;
                      local_a80 = vpshufd_avx(ZEXT416(uVar55),0);
                      auStack_a70 = auVar37._16_16_;
                      auStack_a90 = auVar38._16_16_;
                      local_aa0 = *local_bb0;
                      do {
                        uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_a20 = local_8e0[uVar70 - 8];
                        fVar93 = local_8e0[uVar70];
                        local_a10._4_4_ = fVar93;
                        local_a10._0_4_ = fVar93;
                        local_a10._8_4_ = fVar93;
                        local_a10._12_4_ = fVar93;
                        *(float *)(ray + k * 4 + 0x80) = local_8a0[uVar70 - 8];
                        local_ad0.context = context->user;
                        local_a50 = local_8a0[uVar70];
                        fVar93 = local_880[uVar70];
                        local_a40._4_4_ = fVar93;
                        local_a40._0_4_ = fVar93;
                        local_a40._8_4_ = fVar93;
                        local_a40._12_4_ = fVar93;
                        local_a30 = local_860[uVar70];
                        local_a00 = local_a80._0_8_;
                        uStack_9f8 = local_a80._8_8_;
                        local_9f0 = local_b00;
                        vcmpps_avx(ZEXT1632(local_b00),ZEXT1632(local_b00),0xf);
                        uStack_9dc = (local_ad0.context)->instID[0];
                        local_9e0 = uStack_9dc;
                        uStack_9d8 = uStack_9dc;
                        uStack_9d4 = uStack_9dc;
                        uStack_9d0 = (local_ad0.context)->instPrimID[0];
                        uStack_9cc = uStack_9d0;
                        uStack_9c8 = uStack_9d0;
                        uStack_9c4 = uStack_9d0;
                        local_bc0 = local_aa0._0_8_;
                        uStack_bb8 = local_aa0._8_8_;
                        local_ad0.valid = (int *)&local_bc0;
                        local_ad0.geometryUserPtr = pGVar7->userPtr;
                        local_ad0.hit = (RTCHitN *)&local_a50;
                        local_ad0.N = 4;
                        local_ad0.ray = (RTCRayN *)ray;
                        fStack_a4c = local_a50;
                        fStack_a48 = local_a50;
                        fStack_a44 = local_a50;
                        fStack_a2c = local_a30;
                        fStack_a28 = local_a30;
                        fStack_a24 = local_a30;
                        fStack_a1c = local_a20;
                        fStack_a18 = local_a20;
                        fStack_a14 = local_a20;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar7->occlusionFilterN)(&local_ad0);
                        }
                        auVar53._8_8_ = uStack_bb8;
                        auVar53._0_8_ = local_bc0;
                        if (auVar53 == (undefined1  [16])0x0) {
                          auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar80 = auVar80 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var8)(&local_ad0);
                          }
                          auVar54._8_8_ = uStack_bb8;
                          auVar54._0_8_ = local_bc0;
                          auVar118 = vpcmpeqd_avx((undefined1  [16])0x0,auVar54);
                          auVar80 = auVar118 ^ _DAT_01febe20;
                          auVar119._8_4_ = 0xff800000;
                          auVar119._0_8_ = 0xff800000ff800000;
                          auVar119._12_4_ = 0xff800000;
                          auVar118 = vblendvps_avx(auVar119,*(undefined1 (*) [16])
                                                             (local_ad0.ray + 0x80),auVar118);
                          *(undefined1 (*) [16])(local_ad0.ray + 0x80) = auVar118;
                        }
                        auVar100._8_8_ = 0x100000001;
                        auVar100._0_8_ = 0x100000001;
                        if ((auVar100 & auVar80) != (undefined1  [16])0x0) break;
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar56;
                        uVar71 = uVar71 ^ 1L << (uVar70 & 0x3f);
                        uVar70 = 0;
                        if (uVar71 != 0) {
                          for (; (uVar71 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                          }
                        }
                        bVar78 = uVar71 != 0;
                      } while (bVar78);
                    }
                    if (bVar78) goto LAB_00384aca;
                  }
                }
              }
              uVar63 = uVar63 & uVar63 - 1;
            } while (uVar63 != 0);
          }
          local_b28 = local_b28 + 1;
          bVar77 = local_b28 < local_b30;
        } while (local_b28 != local_b30);
      }
LAB_00384aca:
      uVar55 = 0;
      uVar63 = local_ba0;
      uVar70 = local_b80;
      uVar71 = local_b88;
      uVar72 = local_b90;
      uVar73 = local_b98;
      uVar75 = local_ba8;
      if (bVar77) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar55 = 1;
      }
    }
    puVar68 = local_b68;
    unaff_R13 = local_b78;
  } while ((uVar55 & 3) == 0);
  return local_b70 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }